

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O0

void gtk_down_box(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  gtk_down_frame(x,y,w,h,c);
  gtk_color(c);
  fl_rectf(x + 3,y + 3,w + -5,h + -4);
  fl_yxline(x + w + -2,y + 3,y + h + -3);
  return;
}

Assistant:

static void gtk_down_box(int x, int y, int w, int h, Fl_Color c) {
  gtk_down_frame(x, y, w, h, c);

  gtk_color(c);
  fl_rectf(x + 3, y + 3, w - 5, h - 4);
  fl_yxline(x + w - 2, y + 3, y + h - 3);
}